

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDictionary.cpp
# Opt level: O3

bool IDictionary::isBaseType(string *str)

{
  size_type sVar1;
  pointer pcVar2;
  iterator iVar3;
  int iVar4;
  bool bVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  baseTypes;
  string tempStr;
  allocator_type local_1b1;
  string *local_1b0;
  size_type local_1a8;
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  local_1b0 = str;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"int","");
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"float","");
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"double","");
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"short","");
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"unsigned","");
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"struct","");
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"enum","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"char","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"bool","");
  __l._M_len = 9;
  __l._M_array = &local_150;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_180,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        local_1a0,&local_1b1);
  lVar8 = 0;
  do {
    if (local_40 + lVar8 != *(undefined1 **)((long)local_50 + lVar8)) {
      operator_delete(*(undefined1 **)((long)local_50 + lVar8));
    }
    lVar8 = lVar8 + -0x20;
  } while (lVar8 != -0x120);
  sVar1 = local_1b0->_M_string_length;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  pcVar2 = (local_1b0->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&local_150,pcVar2,pcVar2 + sVar1);
  local_1a8 = sVar1;
  if (-1 < (int)sVar1) {
    uVar6 = (ulong)((int)sVar1 + 1);
    do {
      uVar6 = uVar6 - 1;
      std::__cxx11::string::substr((ulong)local_1a0,(ulong)local_1b0);
      std::__cxx11::string::operator=((string *)&local_150,(string *)local_1a0);
      if (local_1a0[0] != local_190) {
        operator_delete(local_1a0[0]);
      }
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&local_180,&local_150);
    } while (((_Rb_tree_header *)iVar3._M_node == &local_180._M_impl.super__Rb_tree_header) &&
            (uVar6 != 0));
  }
  if (local_150._M_string_length == 0) {
LAB_00104900:
    bVar5 = false;
  }
  else {
    iVar4 = (uint)local_150._M_string_length + 1;
    bVar5 = true;
    iVar7 = (int)local_1a8;
    if (iVar4 < iVar7) {
      lVar8 = (long)iVar4;
      iVar4 = ~(uint)local_150._M_string_length + iVar7;
      do {
        uVar6 = (ulong)(byte)(local_1b0->_M_dataplus)._M_p[lVar8];
        if ((0x2a < uVar6) || ((0x40100002600U >> (uVar6 & 0x3f) & 1) == 0)) goto LAB_00104900;
        lVar8 = lVar8 + 1;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      bVar5 = iVar7 <= lVar8;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_180);
  return bVar5;
}

Assistant:

bool IDictionary::isBaseType(std::string str) {
    std::set<std::string> baseTypes({"int","float","double","short","unsigned","struct","enum","char","bool"});
    int maxLen = str.length();
    std::string tempStr =str;

    for(int i=0;i<=maxLen;i++)
    {
        tempStr=str.substr(0,maxLen-i);
        if(baseTypes.find(tempStr)!=baseTypes.end())
            break;
    }
    if(tempStr.empty())
        return false;

    for(int i=tempStr.length()+1;i<maxLen;i++)
    {
        if(!(isBlankSep(str[i])||str[i]=='*'))
            return false;
    }
    return true;
}